

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

float Abc_NtkComputeFanoutLoad(Bus_Man_t *p,Vec_Ptr_t *vFanouts)

{
  Abc_Obj_t *p_00;
  int i;
  float fVar1;
  float fVar2;
  
  fVar1 = Abc_SclFindWireLoad(p->vWireCaps,vFanouts->nSize);
  for (i = 0; i < vFanouts->nSize; i = i + 1) {
    p_00 = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,i);
    fVar2 = Bus_SclObjCin(p_00);
    fVar1 = fVar1 + fVar2;
  }
  return fVar1;
}

Assistant:

float Abc_NtkComputeFanoutLoad( Bus_Man_t * p, Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pFanout;
    float Load;
    int i;
    Load = Abc_SclFindWireLoad( p->vWireCaps, Vec_PtrSize(vFanouts) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pFanout, i )
        Load += Bus_SclObjCin( pFanout );
    return Load;
}